

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Player::action(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Player *this,int choice)

{
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(choice) {
  case 0:
    move((vector<int,_std::allocator<int>_> *)&_Stack_28,this,1,0);
    break;
  case 1:
    move((vector<int,_std::allocator<int>_> *)&_Stack_28,this,-1,0);
    break;
  case 2:
    move((vector<int,_std::allocator<int>_> *)&_Stack_28,this,0,1);
    break;
  case 3:
    move((vector<int,_std::allocator<int>_> *)&_Stack_28,this,0,-1);
    break;
  default:
    move((vector<int,_std::allocator<int>_> *)&_Stack_28,this,0,0);
  }
  std::vector<int,_std::allocator<int>_>::_M_move_assign(__return_storage_ptr__,&_Stack_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Player::action(int choice)
{
    std::vector<int> vec1;
    if (choice == 0)
    {
        vec1 = this->move(1, 0);
    }
    else if (choice == 1)
    {
        vec1 = this->move(-1, 0);
    }
    else if (choice == 2)
    {
        vec1 = this->move(0, 1);
    }
    else if (choice == 3)
    {
        vec1 = this->move(0, -1);
    }
    else
    {
        vec1 = this->move(0, 0);
    }
    /**
    else if (choice == 4)
    {
        vec1 = this->move(0, 0, 1);
    }
    else if (choice == 5)
    {
        vec1 = this->move(0, 0, -1); //Looks good
     }
     **/
    return vec1;
}